

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setLeaveBound4Row(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,int i,int n)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  pointer pnVar10;
  undefined4 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 *puVar20;
  double *pdVar21;
  pointer pnVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  cpp_dec_float<50U,_int,_void> local_58;
  
  switch((this->
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thedesc.rowstat.data[n]) {
  case P_FIXED:
    pdVar21 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_58,-*pdVar21,(type *)0x0);
    pnVar10 = (this->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(ulong *)((long)&pnVar10[i].m_backend.data + 0x20) =
         CONCAT44(local_58.data._M_elems[9],local_58.data._M_elems[8]);
    puVar1 = (uint *)((long)&pnVar10[i].m_backend.data + 0x10);
    *puVar1 = local_58.data._M_elems[4];
    puVar1[1] = local_58.data._M_elems[5];
    puVar1[2] = local_58.data._M_elems[6];
    puVar1[3] = local_58.data._M_elems[7];
    pnVar22 = pnVar10 + i;
    (pnVar22->m_backend).data._M_elems[0] = local_58.data._M_elems[0];
    *(uint *)((long)&(pnVar22->m_backend).data + 4) = local_58.data._M_elems[1];
    *(uint *)((long)&(pnVar22->m_backend).data + 8) = local_58.data._M_elems[2];
    *(uint *)((long)&(pnVar22->m_backend).data + 0xc) = local_58.data._M_elems[3];
    pnVar10[i].m_backend.exp = local_58.exp;
    pnVar10[i].m_backend.neg = local_58.neg;
    pnVar10[i].m_backend.fpclass = local_58.fpclass;
    pnVar10[i].m_backend.prec_elem = local_58.prec_elem;
    puVar20 = (undefined8 *)infinity();
    uVar23 = (undefined4)*puVar20;
    uVar24 = (undefined4)((ulong)*puVar20 >> 0x20);
    break;
  default:
    pnVar22 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .right.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = *(int *)&pnVar22[n].m_backend.data;
    uVar4 = *(uint *)((long)&pnVar22[n].m_backend.data + 0x24);
    puVar1 = (uint *)((long)&pnVar22[n].m_backend.data + 0x14);
    uVar15 = *(undefined8 *)puVar1;
    uVar16 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar22[n].m_backend.data + 4);
    uVar17 = *(undefined8 *)puVar1;
    uVar18 = *(undefined8 *)(puVar1 + 2);
    iVar5 = pnVar22[n].m_backend.exp;
    pnVar10 = (this->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = pnVar22[n].m_backend.fpclass;
    uVar14 = pnVar22[n].m_backend.prec_elem;
    bVar2 = pnVar22[n].m_backend.neg;
    *(int *)&pnVar10[i].m_backend.data = iVar3;
    puVar1 = (uint *)((long)&pnVar10[i].m_backend.data + 4);
    *(undefined8 *)puVar1 = uVar17;
    *(undefined8 *)(puVar1 + 2) = uVar18;
    puVar1 = (uint *)((long)&pnVar10[i].m_backend.data + 0x14);
    *(undefined8 *)puVar1 = uVar15;
    *(undefined8 *)(puVar1 + 2) = uVar16;
    *(uint *)((long)&pnVar10[i].m_backend.data + 0x24) = uVar4;
    pnVar10[i].m_backend.exp = iVar5;
    pnVar10[i].m_backend.neg = (bool)((iVar3 != 0 || uVar9 != 0) ^ bVar2);
    pnVar10[i].m_backend.fpclass = uVar9;
    pnVar10[i].m_backend.prec_elem = uVar14;
    pnVar22 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .left.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    goto LAB_0024a952;
  case P_ON_LOWER:
    pdVar21 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_58,-*pdVar21,(type *)0x0);
    pnVar22 = (this->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(ulong *)((long)&pnVar22[i].m_backend.data + 0x20) =
         CONCAT44(local_58.data._M_elems[9],local_58.data._M_elems[8]);
    puVar1 = (uint *)((long)&pnVar22[i].m_backend.data + 0x10);
    *(undefined8 *)puVar1 = local_58.data._M_elems._16_8_;
    *(undefined8 *)(puVar1 + 2) = local_58.data._M_elems._24_8_;
    *(undefined8 *)&pnVar22[i].m_backend.data = local_58.data._M_elems._0_8_;
    *(undefined8 *)((long)&pnVar22[i].m_backend.data + 8) = local_58.data._M_elems._8_8_;
    pnVar22[i].m_backend.exp = local_58.exp;
    pnVar22[i].m_backend.neg = local_58.neg;
    pnVar22[i].m_backend.fpclass = local_58.fpclass;
    pnVar22[i].m_backend.prec_elem = local_58.prec_elem;
    pnVar22 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = *(int *)&pnVar22[n].m_backend.data;
    uVar4 = *(uint *)((long)&pnVar22[n].m_backend.data + 0x24);
    puVar1 = (uint *)((long)&pnVar22[n].m_backend.data + 0x14);
    uVar15 = *(undefined8 *)puVar1;
    uVar16 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar22[n].m_backend.data + 4);
    uVar17 = *(undefined8 *)puVar1;
    uVar18 = *(undefined8 *)(puVar1 + 2);
    iVar5 = pnVar22[n].m_backend.exp;
    pnVar10 = (this->theUBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = pnVar22[n].m_backend.fpclass;
    uVar12 = pnVar22[n].m_backend.prec_elem;
    bVar2 = pnVar22[n].m_backend.neg;
    *(int *)&pnVar10[i].m_backend.data = iVar3;
    puVar1 = (uint *)((long)&pnVar10[i].m_backend.data + 4);
    *(undefined8 *)puVar1 = uVar17;
    *(undefined8 *)(puVar1 + 2) = uVar18;
    puVar1 = (uint *)((long)&pnVar10[i].m_backend.data + 0x14);
    *(undefined8 *)puVar1 = uVar15;
    *(undefined8 *)(puVar1 + 2) = uVar16;
    *(uint *)((long)&pnVar10[i].m_backend.data + 0x24) = uVar4;
    pnVar10[i].m_backend.exp = iVar5;
    pnVar10[i].m_backend.neg = (bool)((iVar3 != 0 || uVar7 != 0) ^ bVar2);
    pnVar10[i].m_backend.fpclass = uVar7;
    pnVar10[i].m_backend.prec_elem = uVar12;
    return;
  case P_ON_UPPER:
    pnVar22 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = *(int *)&pnVar22[n].m_backend.data;
    local_58.data._M_elems[8] = *(uint *)((long)&pnVar22[n].m_backend.data + 0x24);
    puVar1 = (uint *)((long)&pnVar22[n].m_backend.data + 0x14);
    local_58.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_58.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar22[n].m_backend.data + 4);
    local_58.data._M_elems._0_8_ = *(undefined8 *)puVar1;
    local_58.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
    iVar5 = pnVar22[n].m_backend.exp;
    pnVar10 = (this->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = pnVar22[n].m_backend.fpclass;
    uVar11 = pnVar22[n].m_backend.prec_elem;
    bVar2 = pnVar22[n].m_backend.neg;
    *(int *)&pnVar10[i].m_backend.data = iVar3;
    puVar1 = (uint *)((long)&pnVar10[i].m_backend.data + 4);
    *puVar1 = local_58.data._M_elems[0];
    puVar1[1] = local_58.data._M_elems[1];
    puVar1[2] = local_58.data._M_elems[2];
    puVar1[3] = local_58.data._M_elems[3];
    puVar1 = (uint *)((long)&pnVar10[i].m_backend.data + 0x14);
    *puVar1 = local_58.data._M_elems[4];
    puVar1[1] = local_58.data._M_elems[5];
    puVar1[2] = local_58.data._M_elems[6];
    puVar1[3] = local_58.data._M_elems[7];
    *(uint *)((long)&pnVar10[i].m_backend.data + 0x24) = local_58.data._M_elems[8];
    pnVar10[i].m_backend.exp = iVar5;
    pnVar10[i].m_backend.neg = (bool)((iVar3 != 0 || uVar6 != 0) ^ bVar2);
    pnVar10[i].m_backend.fpclass = uVar6;
    pnVar10[i].m_backend.prec_elem = uVar11;
    puVar20 = (undefined8 *)infinity();
    uVar23 = (undefined4)*puVar20;
    uVar24 = (undefined4)((ulong)*puVar20 >> 0x20);
    break;
  case P_FREE:
    pnVar22 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = *(int *)&pnVar22[n].m_backend.data;
    uVar4 = *(uint *)((long)&pnVar22[n].m_backend.data + 0x24);
    puVar1 = (uint *)((long)&pnVar22[n].m_backend.data + 0x14);
    uVar15 = *(undefined8 *)puVar1;
    uVar16 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar22[n].m_backend.data + 4);
    uVar17 = *(undefined8 *)puVar1;
    uVar18 = *(undefined8 *)(puVar1 + 2);
    iVar5 = pnVar22[n].m_backend.exp;
    pnVar10 = (this->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = pnVar22[n].m_backend.fpclass;
    uVar13 = pnVar22[n].m_backend.prec_elem;
    bVar2 = pnVar22[n].m_backend.neg;
    *(int *)&pnVar10[i].m_backend.data = iVar3;
    puVar1 = (uint *)((long)&pnVar10[i].m_backend.data + 4);
    *(undefined8 *)puVar1 = uVar17;
    *(undefined8 *)(puVar1 + 2) = uVar18;
    puVar1 = (uint *)((long)&pnVar10[i].m_backend.data + 0x14);
    *(undefined8 *)puVar1 = uVar15;
    *(undefined8 *)(puVar1 + 2) = uVar16;
    *(uint *)((long)&pnVar10[i].m_backend.data + 0x24) = uVar4;
    pnVar10[i].m_backend.exp = iVar5;
    pnVar10[i].m_backend.neg = (bool)((iVar3 != 0 || uVar8 != 0) ^ bVar2);
    pnVar10[i].m_backend.fpclass = uVar8;
    pnVar10[i].m_backend.prec_elem = uVar13;
    pnVar22 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
LAB_0024a952:
    iVar3 = *(int *)&pnVar22[n].m_backend.data;
    uVar4 = *(uint *)((long)&pnVar22[n].m_backend.data + 0x24);
    puVar1 = (uint *)((long)&pnVar22[n].m_backend.data + 0x14);
    uVar16 = *(undefined8 *)puVar1;
    uVar17 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar22[n].m_backend.data + 4);
    uVar18 = *(undefined8 *)puVar1;
    uVar19 = *(undefined8 *)(puVar1 + 2);
    iVar5 = pnVar22[n].m_backend.exp;
    pnVar10 = (this->theUBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar15._0_4_ = pnVar22[n].m_backend.fpclass;
    uVar15._4_4_ = pnVar22[n].m_backend.prec_elem;
    bVar2 = pnVar22[n].m_backend.neg;
    *(int *)(pnVar10 + i) = iVar3;
    *(undefined8 *)((long)(pnVar10 + i) + 4) = uVar18;
    *(undefined8 *)((long)(pnVar10 + i) + 0xc) = uVar19;
    *(undefined8 *)((long)(pnVar10 + i) + 0x14) = uVar16;
    *(undefined8 *)((long)(pnVar10 + i) + 0x1c) = uVar17;
    *(uint *)((long)(pnVar10 + i) + 0x24) = uVar4;
    *(int *)((long)(pnVar10 + i) + 0x28) = iVar5;
    *(char *)((long)(pnVar10 + i) + 0x2c) = (iVar3 != 0 || (undefined4)uVar15 != 0) ^ bVar2;
    *(undefined8 *)((long)(pnVar10 + i) + 0x30) = uVar15;
    return;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_58,(double)CONCAT44(uVar24,uVar23),(type *)0x0);
  pnVar22 = (this->theUBbound).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)((long)(pnVar22 + i) + 0x20) =
       CONCAT44(local_58.data._M_elems[9],local_58.data._M_elems[8]);
  *(undefined8 *)((long)(pnVar22 + i) + 0x10) = local_58.data._M_elems._16_8_;
  *(undefined8 *)((long)(pnVar22 + i) + 0x18) = local_58.data._M_elems._24_8_;
  *(undefined8 *)(pnVar22 + i) = local_58.data._M_elems._0_8_;
  *(undefined8 *)((long)(pnVar22 + i) + 8) = local_58.data._M_elems._8_8_;
  *(int *)((long)(pnVar22 + i) + 0x28) = local_58.exp;
  *(bool *)((long)(pnVar22 + i) + 0x2c) = local_58.neg;
  *(undefined8 *)((long)(pnVar22 + i) + 0x30) = local_58._48_8_;
  return;
}

Assistant:

void SPxSolverBase<R>::setLeaveBound4Row(int i, int n)
{
   assert(this->baseId(i).isSPxRowId());
   assert(this->number(SPxRowId(this->baseId(i))) == n);

   switch(this->desc().rowStatus(n))
   {
   case SPxBasisBase<R>::Desc::P_ON_LOWER :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = -this->maxRowObj(n);
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
      theLBbound[i] = -this->maxRowObj(n);
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER + SPxBasisBase<R>::Desc::P_ON_LOWER :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_FREE :
      theLBbound[i] = -this->maxRowObj(n);
      theUBbound[i] = -this->maxRowObj(n);
      break;

   default:
      assert(rep() == COLUMN);
      theLBbound[i] = -this->rhs(n);                // slacks !
      theUBbound[i] = -this->lhs(n);                // slacks !
      break;
   }
}